

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checked_test.cpp
# Opt level: O0

void __thiscall
CheckedTimedMutexTest_RecurseTryLockUntil_Test<yamc::checked::timed_mutex>::TestBody
          (CheckedTimedMutexTest_RecurseTryLockUntil_Test<yamc::checked::timed_mutex> *this)

{
  bool bVar1;
  char *pcVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  AssertHelper local_1c0;
  Message local_1b8 [6];
  exception *e_2;
  TrueWithString gtest_msg_2;
  Message local_160 [2];
  system_error *anon_var_0;
  type e_1;
  byte local_119;
  undefined1 local_118 [7];
  bool gtest_caught_expected;
  TrueWithString gtest_msg_1;
  AssertHelper local_d8;
  Message local_d0 [6];
  exception *e;
  undefined1 local_90 [8];
  TrueWithString gtest_msg;
  TypeParam mtx;
  CheckedTimedMutexTest_RecurseTryLockUntil_Test<yamc::checked::timed_mutex> *this_local;
  
  yamc::checked::timed_mutex::timed_mutex((timed_mutex *)(gtest_msg.value.field_2._M_local_buf + 8))
  ;
  memset(local_90,0,0x20);
  testing::internal::TrueWithString::TrueWithString((TrueWithString *)local_90);
  bVar1 = testing::internal::TrueWithString::operator_cast_to_bool((TrueWithString *)local_90);
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      yamc::checked::detail::mutex_base::lock((mutex_base *)((long)&gtest_msg.value.field_2 + 8));
    }
    e._0_4_ = 0;
  }
  else {
    testing::Message::Message(local_d0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&gtest_msg_1.value.field_2 + 8),
                   "Expected: mtx.lock() doesn\'t throw an exception.\n  Actual: ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/yohhoy[P]yamc/tests/checked_test.cpp"
               ,0xf0,pcVar2);
    testing::internal::AssertHelper::operator=(&local_d8,local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    std::__cxx11::string::~string((string *)(gtest_msg_1.value.field_2._M_local_buf + 8));
    testing::Message::~Message(local_d0);
    e._0_4_ = 1;
  }
  testing::internal::TrueWithString::~TrueWithString((TrueWithString *)local_90);
  if ((int)e != 0) goto LAB_001f9c17;
  memset(local_118,0,0x20);
  testing::internal::TrueWithString::TrueWithString((TrueWithString *)local_118);
  bVar1 = testing::internal::TrueWithString::operator_cast_to_bool((TrueWithString *)local_118);
  if (bVar1) {
    local_119 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      e_1 = (type)std::chrono::_V2::system_clock::now();
      yamc::checked::timed_mutex::
      try_lock_until<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                ((timed_mutex *)(gtest_msg.value.field_2._M_local_buf + 8),
                 (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                  *)&e_1);
    }
    if ((local_119 & 1) == 0) {
      std::__cxx11::string::operator=
                ((string *)local_118,
                 "Expected: mtx.try_lock_until(std::chrono::system_clock::now()) throws an exception of type std::system_error.\n  Actual: it throws nothing."
                );
      goto LAB_001f9808;
    }
  }
  else {
LAB_001f9808:
    testing::Message::Message(local_160);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)((long)&gtest_msg_2.value.field_2 + 8),kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/yohhoy[P]yamc/tests/checked_test.cpp"
               ,0xf1,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)((long)&gtest_msg_2.value.field_2 + 8),local_160);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)((long)&gtest_msg_2.value.field_2 + 8));
    testing::Message::~Message(local_160);
  }
  testing::internal::TrueWithString::~TrueWithString((TrueWithString *)local_118);
  memset(&e_2,0,0x20);
  testing::internal::TrueWithString::TrueWithString((TrueWithString *)&e_2);
  bVar1 = testing::internal::TrueWithString::operator_cast_to_bool((TrueWithString *)&e_2);
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      yamc::checked::detail::mutex_base::unlock((mutex_base *)((long)&gtest_msg.value.field_2 + 8));
    }
    e._0_4_ = 0;
  }
  else {
    testing::Message::Message(local_1b8);
    std::operator+(&local_1e0,"Expected: mtx.unlock() doesn\'t throw an exception.\n  Actual: ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&e_2);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1c0,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/yohhoy[P]yamc/tests/checked_test.cpp"
               ,0xf2,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1c0,local_1b8);
    testing::internal::AssertHelper::~AssertHelper(&local_1c0);
    std::__cxx11::string::~string((string *)&local_1e0);
    testing::Message::~Message(local_1b8);
    e._0_4_ = 1;
  }
  testing::internal::TrueWithString::~TrueWithString((TrueWithString *)&e_2);
  if ((int)e == 0) {
    e._0_4_ = 0;
  }
LAB_001f9c17:
  yamc::checked::timed_mutex::~timed_mutex
            ((timed_mutex *)(gtest_msg.value.field_2._M_local_buf + 8));
  return;
}

Assistant:

TYPED_TEST(CheckedTimedMutexTest, RecurseTryLockUntil) {
  TypeParam mtx;
  ASSERT_NO_THROW(mtx.lock());
  EXPECT_CHECK_FAILURE(mtx.try_lock_until(std::chrono::system_clock::now()));
  ASSERT_NO_THROW(mtx.unlock());
}